

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O2

void __thiscall HashUtil_Sha512BytePubkey_Test::TestBody(HashUtil_Sha512BytePubkey_Test *this)

{
  char *message;
  AssertHelper local_70;
  string local_68;
  AssertionResult gtest_ar;
  ByteData byte_data;
  Pubkey target;
  
  std::__cxx11::string::string
            ((string *)&local_68,
             "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db",
             (allocator *)&byte_data);
  cfd::core::Pubkey::Pubkey(&target,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  cfd::core::HashUtil::Sha512(&byte_data,&target);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_68,&byte_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"byte_data.GetHex().c_str()",
             "\"3f7a5ecb744920c058e56759f853698ab2cbb62fa511f2211cc50f72152967d5545e67e13bcc19aeb4e699e417ac0c878342e3775d36a8e0b4cd75b1bd924b68\""
             ,local_68._M_dataplus._M_p,
             "3f7a5ecb744920c058e56759f853698ab2cbb62fa511f2211cc50f72152967d5545e67e13bcc19aeb4e699e417ac0c878342e3775d36a8e0b4cd75b1bd924b68"
            );
  std::__cxx11::string::~string((string *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x147,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&target);
  return;
}

Assistant:

TEST(HashUtil, Sha512BytePubkey) {
  Pubkey target(
      "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db");
  ByteData byte_data = HashUtil::Sha512(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "3f7a5ecb744920c058e56759f853698ab2cbb62fa511f2211cc50f72152967d5545e67e13bcc19aeb4e699e417ac0c878342e3775d36a8e0b4cd75b1bd924b68");
}